

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestinitiatorFixtureResendRequest_AResentMessageReceivesADoNotSendException::
TestinitiatorFixtureResendRequest_AResentMessageReceivesADoNotSendException
          (TestinitiatorFixtureResendRequest_AResentMessageReceivesADoNotSendException *this)

{
  char *suiteName;
  TestinitiatorFixtureResendRequest_AResentMessageReceivesADoNotSendException *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"ResendRequest_AResentMessageReceivesADoNotSendException",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x882);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__TestinitiatorFixtureResendRequest_AResentMessageReceivesADoNotSendException_0045b2f0;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_AResentMessageReceivesADoNotSendException) {
  startLoggedOn();

  FIX::Message neworder1 = createNewOrderSingle("ISLD", "TW", 2);
  object->send(neworder1);

  FIX::Message neworder2 = createNewOrderSingle("ISLD", "TW", 3);
  neworder2.setField(FIX::Text("DoNotSend"));
  object->send(neworder2);

  this->checkForDoNotSend = true;

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 8);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(3, object->getExpectedTargetNum());
}